

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

unsigned_short * lzham::lzham_new_array<unsigned_short>(uint32 num)

{
  void *pvVar1;
  uint in_EDI;
  unsigned_short *p;
  uint8 *q;
  size_t *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  undefined4 local_c;
  undefined8 local_8;
  
  local_c = in_EDI;
  if (in_EDI == 0) {
    local_c = 1;
  }
  pvVar1 = lzham_malloc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pvVar1 == (void *)0x0) {
    local_8 = (unsigned_short *)0x0;
  }
  else {
    local_8 = (unsigned_short *)((long)pvVar1 + 0x10);
    *(uint *)((long)pvVar1 + 0xc) = local_c;
    *(uint *)((long)pvVar1 + 8) = local_c ^ 0xffffffff;
  }
  return local_8;
}

Assistant:

inline T* lzham_new_array(uint32 num)
   {
      if (!num) num = 1;

      uint8* q = static_cast<uint8*>(lzham_malloc(LZHAM_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
      if (!q)
         return NULL;

      T* p = reinterpret_cast<T*>(q + LZHAM_MIN_ALLOC_ALIGNMENT);

      reinterpret_cast<uint32*>(p)[-1] = num;
      reinterpret_cast<uint32*>(p)[-2] = ~num;

      if (!LZHAM_IS_SCALAR_TYPE(T))
      {
         helpers::construct_array(p, num);
      }
      return p;
   }